

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

void dg::dda::MemorySSATransformation::performLvn(Definitions *D,RWBBlock *block)

{
  bool bVar1;
  BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode> *in_RSI;
  Definitions *in_RDI;
  RWNode *node;
  iterator __end2;
  iterator __begin2;
  NodesT *__range2;
  list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  NodesT *local_18;
  Definitions *local_8;
  
  local_8 = in_RDI;
  local_18 = BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode>::getNodes_abi_cxx11_(in_RSI);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::_List_iterator<dg::dda::RWNode_*>::operator*((_List_iterator<dg::dda::RWNode_*> *)0x174dfa)
    ;
    Definitions::update((Definitions *)__range2,(RWNode *)__begin2._M_node,(RWNode *)__end2._M_node)
    ;
    std::_List_iterator<dg::dda::RWNode_*>::operator++(&local_20);
  }
  Definitions::setProcessed(local_8);
  return;
}

Assistant:

void MemorySSATransformation::performLvn(Definitions &D, RWBBlock *block) {
    DBG_SECTION_BEGIN(dda, "Starting LVN for block " << block->getID());

    assert(!D.isProcessed() && "Processing a block multiple times");

    for (RWNode *node : block->getNodes()) {
        D.update(node);
    }

    D.setProcessed();
    DBG_SECTION_END(dda, "LVN of block " << block->getID() << " finished");
}